

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

void cp_decl_attributes(CPState *cp,CPDecl *decl)

{
  GCstr *pGVar1;
  TValue *pTVar2;
  uint uVar3;
  int iVar4;
  CTSize CVar5;
  uint uVar6;
  char cVar7;
  int iVar8;
  GCstr *pGVar9;
  bool bVar10;
  
LAB_00149eed:
  do {
    switch(cp->tok) {
    case 0x118:
      uVar3 = decl->attr;
      uVar6 = 0x2000000;
      break;
    case 0x119:
      uVar3 = decl->attr;
      uVar6 = 0x1000000;
      break;
    case 0x11a:
    case 0x121:
    case 0x125:
      goto switchD_00149f03_caseD_11a;
    default:
      return;
    case 0x122:
      cp_next(cp);
      cp_check(cp,0x28);
      if (cp->tok == 0x101) {
        pGVar9 = cp->str;
        iVar4 = cp_next(cp);
        while (iVar4 == 0x101) {
          lj_strfmt_pushf(cp->L,"%s%s",pGVar9 + 1,cp->str + 1);
          pTVar2 = cp->L->top;
          cp->L->top = pTVar2 + -1;
          pGVar9 = (GCstr *)(pTVar2[-1].u64 & 0x7fffffffffff);
          iVar4 = cp_next(cp);
        }
        decl->redir = pGVar9;
      }
      goto LAB_0014a29f;
    case 0x123:
      cp_next(cp);
      cp_check(cp,0x28);
      cp_check(cp,0x28);
      do {
        iVar4 = cp->tok;
        if (iVar4 == 0x100) {
          pGVar9 = cp->str;
          cp_next(cp);
          iVar4 = lj_cparse_case(pGVar9,
                                 "\aaligned\v__aligned__\x06packed\n__packed__\x04mode\b__mode__\vvector_size\x0f__vector_size__"
                                );
          switch(iVar4) {
          case 0:
          case 1:
            cp_decl_align(cp,decl);
            break;
          case 2:
          case 3:
            *(byte *)&decl->attr = (byte)decl->attr | 2;
            break;
          case 4:
          case 5:
            cp_check(cp,0x28);
            if (cp->tok != 0x100) goto LAB_0014a13c;
            pGVar1 = cp->str;
            pGVar9 = pGVar1 + 1;
            cVar7 = (char)pGVar1[1].nextgc.gcptr64;
            if (cVar7 == '_') {
              bVar10 = *(char *)((long)&pGVar1[1].nextgc.gcptr64 + 1) == '_';
              if (bVar10) {
                pGVar9 = (GCstr *)((long)&pGVar1[1].nextgc.gcptr64 + 2);
              }
              cVar7 = *(char *)((long)&pGVar1[1].nextgc.gcptr64 + (ulong)bVar10 * 2);
            }
            iVar4 = 0;
            if (cVar7 == 'V') {
              iVar4 = *(char *)((long)&(pGVar9->nextgc).gcptr64 + 1) + -0x30;
              cVar7 = *(char *)((long)&(pGVar9->nextgc).gcptr64 + 2);
              if ((byte)(cVar7 - 0x30U) < 10) {
                iVar4 = (uint)(byte)(cVar7 - 0x30U) + iVar4 * 10;
                cVar7 = *(char *)((long)&(pGVar9->nextgc).gcptr64 + 3);
                pGVar9 = (GCstr *)((long)&(pGVar9->nextgc).gcptr64 + 3);
              }
              else {
                pGVar9 = (GCstr *)((long)&(pGVar9->nextgc).gcptr64 + 2);
              }
            }
            switch(cVar7) {
            case 'O':
              iVar8 = 0x20;
              break;
            case 'P':
            case 'R':
              goto switchD_0014a0bc_caseD_50;
            case 'Q':
              iVar8 = 1;
              break;
            case 'S':
              iVar8 = 4;
              break;
            case 'T':
              iVar8 = 0x10;
              break;
            default:
              if (cVar7 == 'D') {
                iVar8 = 8;
              }
              else {
                if (cVar7 != 'H') goto switchD_0014a0bc_caseD_50;
                iVar8 = 2;
              }
            }
            cVar7 = *(char *)((long)&(pGVar9->nextgc).gcptr64 + 1);
            if ((cVar7 == 'I') || (cVar7 == 'F')) {
              uVar3 = decl->attr;
              decl->attr = iVar8 << 8 | uVar3 & 0xffff00ff;
              if (iVar4 != 0) {
                uVar6 = 0x1f;
                if (iVar8 * iVar4 != 0) {
                  for (; (uint)(iVar8 * iVar4) >> uVar6 == 0; uVar6 = uVar6 - 1) {
                  }
                }
                decl->attr = ((~uVar6 & 0xf) << 4 | iVar8 << 8 | uVar3 & 0xffff000f) ^ 0xf0;
              }
            }
switchD_0014a0bc_caseD_50:
            cp_next(cp);
            goto LAB_0014a13c;
          case 6:
          case 7:
            CVar5 = cp_decl_sizeattr(cp);
            if (CVar5 != 0) {
              uVar3 = 0x1f;
              if (CVar5 != 0) {
                for (; CVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
                }
              }
              decl->attr = ((~uVar3 & 0xf) << 4 | decl->attr & 0xffffff0f) ^ 0xf0;
            }
            break;
          default:
            goto switchD_00149fe2_default;
          }
LAB_0014a149:
          iVar4 = cp->tok;
        }
        else {
          if ((iVar4 == 0x29) || (iVar4 < 0x10d)) goto LAB_0014a15f;
          cp_next(cp);
switchD_00149fe2_default:
          iVar4 = cp->tok;
          if (iVar4 == 0x28) {
            do {
              cp_next(cp);
              if (cp->tok == 0x103) break;
            } while (cp->tok != 0x29);
LAB_0014a13c:
            cp_check(cp,0x29);
            goto LAB_0014a149;
          }
        }
        if (iVar4 != 0x2c) goto LAB_0014a15f;
        cp_next(cp);
      } while( true );
    case 0x124:
      cp_next(cp);
      cp_check(cp,0x28);
      iVar4 = cp->tok;
joined_r0x0014a22d:
      if (iVar4 == 0x100) {
        pGVar9 = cp->str;
        cp_next(cp);
        if ((pGVar9->len != 5) ||
           (*(char *)((long)&pGVar9[1].nextgc.gcptr64 + 4) != 'n' ||
            (int)pGVar9[1].nextgc.gcptr64 != 0x67696c61)) goto LAB_0014a259;
        cp_decl_align(cp,decl);
        goto LAB_0014a294;
      }
      goto LAB_0014a29f;
    case 0x126:
      uVar6 = decl->attr & 0xffff00ff;
      uVar3 = (cp->ct->size & 0xff) << 8;
    }
    decl->attr = uVar3 | uVar6;
switchD_00149f03_caseD_11a:
    cp_next(cp);
  } while( true );
LAB_0014a259:
  iVar4 = cp->tok;
  if (iVar4 == 0x28) {
    do {
      cp_next(cp);
      if (cp->tok == 0x103) break;
    } while (cp->tok != 0x29);
    cp_check(cp,0x29);
LAB_0014a294:
    iVar4 = cp->tok;
  }
  goto joined_r0x0014a22d;
LAB_0014a15f:
  cp_check(cp,0x29);
LAB_0014a29f:
  cp_check(cp,0x29);
  goto LAB_00149eed;
}

Assistant:

static void cp_decl_attributes(CPState *cp, CPDecl *decl)
{
  for (;;) {
    switch (cp->tok) {
    case CTOK_CONST: decl->attr |= CTF_CONST; break;
    case CTOK_VOLATILE: decl->attr |= CTF_VOLATILE; break;
    case CTOK_RESTRICT: break;  /* Ignore. */
    case CTOK_EXTENSION: break;  /* Ignore. */
    case CTOK_ATTRIBUTE: cp_decl_gccattribute(cp, decl); continue;
    case CTOK_ASM: cp_decl_asm(cp, decl); continue;
    case CTOK_DECLSPEC: cp_decl_msvcattribute(cp, decl); continue;
    case CTOK_CCDECL:
#if LJ_TARGET_X86
      CTF_INSERT(decl->fattr, CCONV, cp->ct->size);
      decl->fattr |= CTFP_CCONV;
#endif
      break;
    case CTOK_PTRSZ:
#if LJ_64
      CTF_INSERT(decl->attr, MSIZEP, cp->ct->size);
#endif
      break;
    default: return;
    }
    cp_next(cp);
  }
}